

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *__return_storage_ptr__,
         utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
         *this,unsigned_long *key,time_point now,peek peek)

{
  iterator iVar1;
  long lVar2;
  element *e;
  
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x50),key);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
      != (__node_type *)0x0) {
    lVar2 = *(size_t *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur + 0x10) * 0x40;
    if ((long)now.__d.__r < *(long *)(*(long *)(this + 0x38) + lVar2)) {
      e = (element *)(*(long *)(this + 0x38) + lVar2);
      if (peek == no) {
        do_access(this,e);
      }
      std::_Optional_payload_base<std::__cxx11::string>::
      _Optional_payload_base<std::__cxx11::string&>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,&e->m_value)
      ;
      return __return_storage_ptr__;
    }
    do_erase(this,*(size_t *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                          ._M_cur + 0x10));
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

auto do_find(const key_type& key, std::chrono::steady_clock::time_point now, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];

            // Has the element TTL'ed?
            if (now < e.m_expire_time)
            {
                // Do not update items access if peeking.
                if (peek == peek::no)
                {
                    do_access(e);
                }
                return {e.m_value};
            }
            else
            {
                do_erase(element_idx);
            }
        }

        return {};
    }